

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void file_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *puVar3;
  long lVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_928 [448];
  uv_fs_t *puStack_768;
  long lStack_758;
  long lStack_750;
  uv_fs_t *apuStack_748 [56];
  undefined8 auStack_588 [56];
  undefined8 auStack_3c8 [11];
  uv_fs_t *puStack_370;
  undefined1 auStack_208 [448];
  
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0018beec;
    if (opendir_req.result != -0x14) goto LAB_0018befb;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0018beec:
    file_opendir_cb_cold_2();
LAB_0018befb:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_768 = (uv_fs_t *)0x18bf25;
  cleanup_test_files();
  puStack_768 = (uv_fs_t *)0x18bf2a;
  uVar2 = uv_default_loop();
  puStack_768 = (uv_fs_t *)0x18bf49;
  iVar1 = uv_fs_mkdir(uVar2,auStack_208,"test_dir",0x1ed,0);
  apuStack_748[0] = (uv_fs_t *)(long)iVar1;
  auStack_3c8[0] = 0;
  if (apuStack_748[0] == (uv_fs_t *)0x0) {
    puStack_768 = (uv_fs_t *)0x18bf74;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18bf99;
    iVar1 = uv_fs_open(uVar2,auStack_3c8,"test_dir/file1",0x41,0x180,0);
    puVar3 = puStack_370;
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    auStack_588[0] = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c580;
    apuStack_748[0] = puStack_370;
    auStack_588[0] = 0;
    if ((long)puStack_370 < 0) goto LAB_0018c592;
    puStack_768 = (uv_fs_t *)0x18bff8;
    uv_fs_req_cleanup(auStack_3c8);
    puStack_768 = (uv_fs_t *)0x18bffd;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c011;
    iVar1 = uv_fs_close(uVar2,auStack_588,(ulong)puVar3 & 0xffffffff,0);
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c5a4;
    puStack_768 = (uv_fs_t *)0x18c03e;
    uv_fs_req_cleanup(auStack_588);
    puStack_768 = (uv_fs_t *)0x18c043;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c068;
    iVar1 = uv_fs_open(uVar2,auStack_3c8,"test_dir/file2",0x41,0x180,0);
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c5b3;
    apuStack_748[0] = puStack_370;
    lStack_758 = 0;
    puVar3 = puStack_370;
    if ((long)puStack_370 < 0) goto LAB_0018c5c2;
    puStack_768 = (uv_fs_t *)0x18c0bb;
    uv_fs_req_cleanup(auStack_3c8);
    puStack_768 = (uv_fs_t *)0x18c0c0;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c0d4;
    iVar1 = uv_fs_close(uVar2,auStack_588,(ulong)puStack_370 & 0xffffffff,0);
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c5d1;
    puStack_768 = (uv_fs_t *)0x18c101;
    uv_fs_req_cleanup(auStack_588);
    puStack_768 = (uv_fs_t *)0x18c106;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c125;
    iVar1 = uv_fs_mkdir(uVar2,auStack_208,"test_dir/test_subdir",0x1ed,0);
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c5e0;
    puStack_768 = (uv_fs_t *)0x18c152;
    uv_fs_req_cleanup(auStack_208);
    puVar3 = &opendir_req;
    puStack_768 = (uv_fs_t *)0x18c16b;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_768 = (uv_fs_t *)0x18c170;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c184;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    unaff_RBX = (uv_fs_t *)opendir_req.ptr;
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c5ef;
    apuStack_748[0] = (uv_fs_t *)(long)opendir_req.fs_type;
    lStack_758 = 0x1f;
    if (apuStack_748[0] != (uv_fs_t *)0x1f) goto LAB_0018c5fe;
    apuStack_748[0] = (uv_fs_t *)opendir_req.result;
    lStack_758 = 0;
    if (opendir_req.result != 0) goto LAB_0018c60d;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018c61c;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)unaff_RBX + 8) = 1;
    puStack_768 = (uv_fs_t *)0x18c21c;
    uv_fs_req_cleanup(&opendir_req);
    puStack_768 = (uv_fs_t *)0x18c221;
    uVar2 = uv_default_loop();
    lVar4 = 0;
    puStack_768 = (uv_fs_t *)0x18c238;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
    if (iVar1 != 0) {
      lVar4 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_768 = (uv_fs_t *)0x18c26a;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_768 = (uv_fs_t *)0x18c27d;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_0018c294;
          puStack_768 = (uv_fs_t *)0x18c28c;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_0018c294;
LAB_0018c55a:
          puStack_768 = (uv_fs_t *)0x18c55f;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0018c55f:
          puStack_768 = (uv_fs_t *)0x18c56e;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_0018c56e;
        }
LAB_0018c294:
        puStack_768 = (uv_fs_t *)0x18c29f;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          apuStack_748[0] = (uv_fs_t *)(ulong)dirents[0].type;
          lStack_758 = 2;
          if (apuStack_748[0] == (uv_fs_t *)0x2) goto LAB_0018c2ec;
          goto LAB_0018c55f;
        }
        apuStack_748[0] = (uv_fs_t *)(ulong)dirents[0].type;
        lStack_758 = 1;
        if (apuStack_748[0] != (uv_fs_t *)0x1) {
          puStack_768 = (uv_fs_t *)0x18c55a;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_0018c55a;
        }
LAB_0018c2ec:
        apuStack_748[0] = (uv_fs_t *)(ulong)dirents[0].type;
        puStack_768 = (uv_fs_t *)0x18c2f4;
        uv_fs_req_cleanup(&readdir_req);
        lVar4 = lVar4 + 1;
        puStack_768 = (uv_fs_t *)0x18c2fc;
        uVar2 = uv_default_loop();
        puStack_768 = (uv_fs_t *)0x18c30c;
        iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
      } while (iVar1 != 0);
    }
    apuStack_748[0] = (uv_fs_t *)0x3;
    lStack_758 = lVar4;
    if (lVar4 != 3) goto LAB_0018c621;
    puStack_768 = (uv_fs_t *)0x18c33e;
    uv_fs_req_cleanup(&readdir_req);
    puStack_768 = (uv_fs_t *)0x18c357;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_768 = (uv_fs_t *)0x18c35c;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c36c;
    uv_fs_closedir(uVar2,&closedir_req,unaff_RBX,0);
    apuStack_748[0] = (uv_fs_t *)closedir_req.result;
    lStack_758 = 0;
    if (closedir_req.result != 0) goto LAB_0018c630;
    puStack_768 = (uv_fs_t *)0x18c39d;
    uv_fs_req_cleanup(&closedir_req);
    unaff_RBX = &opendir_req;
    puStack_768 = (uv_fs_t *)0x18c3b6;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_768 = (uv_fs_t *)0x18c3bb;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c3d4;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c63f;
    apuStack_748[0] = (uv_fs_t *)(long)non_empty_opendir_cb_count;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c64e;
    apuStack_748[0] = (uv_fs_t *)(long)non_empty_closedir_cb_count;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c65d;
    puStack_768 = (uv_fs_t *)0x18c443;
    uVar2 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x18c44d;
    iVar1 = uv_run(uVar2,0);
    apuStack_748[0] = (uv_fs_t *)(long)iVar1;
    lStack_758 = 0;
    if (apuStack_748[0] != (uv_fs_t *)0x0) goto LAB_0018c66c;
    apuStack_748[0] = (uv_fs_t *)0x1;
    lStack_758 = (long)non_empty_opendir_cb_count;
    if (lStack_758 != 1) goto LAB_0018c67b;
    apuStack_748[0] = (uv_fs_t *)0x1;
    lStack_758 = (long)non_empty_closedir_cb_count;
    if (lStack_758 == 1) {
      puStack_768 = (uv_fs_t *)0x18c4bc;
      uVar2 = uv_default_loop();
      puStack_768 = (uv_fs_t *)0x18c4d5;
      uv_fs_rmdir(uVar2,apuStack_748,"test_subdir",0);
      puStack_768 = (uv_fs_t *)0x18c4dd;
      uv_fs_req_cleanup(apuStack_748);
      puStack_768 = (uv_fs_t *)0x18c4e2;
      cleanup_test_files();
      puStack_768 = (uv_fs_t *)0x18c4e7;
      unaff_RBX = (uv_fs_t *)uv_default_loop();
      puStack_768 = (uv_fs_t *)0x18c4fb;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_768 = (uv_fs_t *)0x18c505;
      uv_run(unaff_RBX,0);
      lStack_758 = 0;
      puStack_768 = (uv_fs_t *)0x18c513;
      uVar2 = uv_default_loop();
      puStack_768 = (uv_fs_t *)0x18c51b;
      iVar1 = uv_loop_close(uVar2);
      lStack_750 = (long)iVar1;
      if (lStack_758 == lStack_750) {
        puStack_768 = (uv_fs_t *)0x18c537;
        uv_library_shutdown();
        return;
      }
      goto LAB_0018c699;
    }
  }
  else {
LAB_0018c56e:
    puStack_768 = (uv_fs_t *)0x18c580;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_0018c580:
    puVar3 = unaff_RBX;
    puStack_768 = (uv_fs_t *)0x18c592;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0018c592:
    puStack_768 = (uv_fs_t *)0x18c5a4;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_0018c5a4:
    puStack_768 = (uv_fs_t *)0x18c5b3;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0018c5b3:
    puStack_768 = (uv_fs_t *)0x18c5c2;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0018c5c2:
    puStack_768 = (uv_fs_t *)0x18c5d1;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_0018c5d1:
    puStack_768 = (uv_fs_t *)0x18c5e0;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0018c5e0:
    puStack_768 = (uv_fs_t *)0x18c5ef;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0018c5ef:
    puStack_768 = (uv_fs_t *)0x18c5fe;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0018c5fe:
    puStack_768 = (uv_fs_t *)0x18c60d;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0018c60d:
    unaff_RBX = puVar3;
    puStack_768 = (uv_fs_t *)0x18c61c;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0018c61c:
    puStack_768 = (uv_fs_t *)0x18c621;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0018c621:
    puStack_768 = (uv_fs_t *)0x18c630;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0018c630:
    puStack_768 = (uv_fs_t *)0x18c63f;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0018c63f:
    puStack_768 = (uv_fs_t *)0x18c64e;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0018c64e:
    puStack_768 = (uv_fs_t *)0x18c65d;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0018c65d:
    puStack_768 = (uv_fs_t *)0x18c66c;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0018c66c:
    puStack_768 = (uv_fs_t *)0x18c67b;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_0018c67b:
    puStack_768 = (uv_fs_t *)0x18c68a;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_768 = (uv_fs_t *)0x18c699;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_0018c699:
  puStack_768 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_768 = unaff_RBX;
  uv_fs_unlink(0,auStack_928,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_928);
  uv_fs_unlink(0,auStack_928,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_928);
  uv_fs_rmdir(0,auStack_928,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_928);
  uv_fs_rmdir(0,auStack_928,"test_dir",0);
  uv_fs_req_cleanup(auStack_928);
  return;
}

Assistant:

static void file_opendir_cb(uv_fs_t* req) {
  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(req->result, UV_ENOTDIR);
  ASSERT_NULL(req->ptr);

  uv_fs_req_cleanup(req);
  ++file_opendir_cb_count;
}